

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

bool __thiscall duckdb::WindowHashGroup::TryPrepareNextStage(WindowHashGroup *this)

{
  WindowGroupStage WVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  WVar1 = (this->stage)._M_i;
  bVar3 = true;
  if (WVar1 == FINALIZE) {
    WVar1 = GETDATA;
    if ((this->finalized).super___atomic_base<unsigned_long>._M_i != this->blocks) {
LAB_014dc780:
      bVar3 = false;
      goto LAB_014dc782;
    }
  }
  else {
    if (WVar1 != SINK) goto LAB_014dc782;
    WVar1 = FINALIZE;
    if ((this->sunk).super___atomic_base<unsigned_long>._M_i != this->count) goto LAB_014dc780;
  }
  LOCK();
  (this->stage)._M_i = WVar1;
  UNLOCK();
LAB_014dc782:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return bVar3;
}

Assistant:

bool TryPrepareNextStage() {
		lock_guard<mutex> prepare_guard(lock);
		switch (stage.load()) {
		case WindowGroupStage::SINK:
			if (sunk == count) {
				stage = WindowGroupStage::FINALIZE;
				return true;
			}
			return false;
		case WindowGroupStage::FINALIZE:
			if (finalized == blocks) {
				stage = WindowGroupStage::GETDATA;
				return true;
			}
			return false;
		default:
			// never block in GETDATA
			return true;
		}
	}